

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Client::HandleTimeout(Client *this,void *param_1)

{
  ostream *poVar1;
  __node_base *p_Var2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"timeout, to stop connections");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::mutex::lock(&this->_mutex);
  p_Var2 = &(this->_sessions)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[6]._M_nxt)();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

void HandleTimeout(void*) {
        std::cout << "timeout, to stop connections" << std::endl;
        std::lock_guard<std::mutex> lock(_mutex);
        for (auto& session : _sessions) {
            session.first->Close();
        }
    }